

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

Image * MakeLightImage(Image *__return_storage_ptr__,Point2i res)

{
  undefined4 uVar1;
  Allocator alloc;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  Image *image;
  int local_b8;
  ulong local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  ColorEncodingHandle local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"R","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"G","");
  plVar6 = local_48;
  local_58[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"B","");
  local_38.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = &local_98;
  pbrt::Image::Image(__return_storage_ptr__,Float,res,channels,&local_38,alloc);
  lVar4 = -0x60;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  local_b8 = res.super_Tuple2<pbrt::Point2,_int>.y;
  if (0 < local_b8) {
    uVar2 = res.super_Tuple2<pbrt::Point2,_int>.x;
    iVar5 = 0;
    lVar4 = 0;
    local_b0 = 0;
    do {
      if (0 < (int)uVar2) {
        iVar3 = 0;
        uVar7 = 0;
        do {
          uVar1 = 0;
          if ((400 < uVar7 || (int)uVar7 - 0x1eU < 0xab) && (int)local_b0 - 0x28U < 0xb5) {
            fVar8 = sinf((float)iVar3 / (float)(int)(local_b8 * uVar2));
            auVar9._0_4_ = (float)((double)fVar8 + 0.2);
            auVar9._4_4_ = (int)((ulong)((double)fVar8 + 0.2) >> 0x20);
            auVar9._8_8_ = 0;
            auVar9 = vmaxss_avx(auVar9,ZEXT416(0));
            uVar1 = auVar9._0_4_;
          }
          local_98._M_string_length._0_4_ = uVar1;
          local_98._M_dataplus._M_p._4_4_ = (undefined4)local_98._M_string_length;
          local_98._M_dataplus._M_p._0_4_ = (undefined4)local_98._M_string_length;
          values.n = 3;
          values.ptr = (float *)&local_98;
          pbrt::Image::SetChannels(__return_storage_ptr__,(Point2i)(lVar4 + uVar7),values);
          uVar7 = uVar7 + 1;
          iVar3 = iVar3 + iVar5;
        } while ((uVar2 & 0x7fffffff) != uVar7);
      }
      local_b0 = local_b0 + 1;
      lVar4 = lVar4 + 0x100000000;
      iVar5 = iVar5 + 100;
    } while (local_b0 != (ulong)res.super_Tuple2<pbrt::Point2,_int> >> 0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

static Image MakeLightImage(Point2i res) {
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            Float val = 0;
            if (((x >= 30 && x <= 200) || x > 400) && y >= 40 && y <= 220) {
                val = .2 + std::sin(100 * x * y / Float(res[0] * res[1]));
                val = std::max(Float(0), val);
            }
            image.SetChannels({x, y}, {val, val, val});
        }
    return image;
}